

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

char * qpdf_get_info_key(qpdf_data qpdf,char *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  QPDFObjectHandle value;
  QPDFObjectHandle info;
  QPDFObjectHandle trailer;
  allocator<char> local_71;
  string local_70;
  QPDFObjectHandle local_50;
  string local_40;
  
  QPDF::getTrailer((qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/Info","");
  bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_40.field_2,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/Info","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_40,(string *)&local_40.field_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,key,(allocator<char> *)&local_50);
    bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_40,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,key,&local_71);
      QPDFObjectHandle::getKey(&local_50,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar2 = QPDFObjectHandle::isString(&local_50);
      if (bVar2) {
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_70,&local_50);
        std::__cxx11::string::operator=((string *)&qpdf->tmp_string,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = (qpdf->tmp_string)._M_dataplus._M_p;
      }
      else {
        pcVar3 = (char *)0x0;
      }
      if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    else {
      pcVar3 = (char *)0x0;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length);
    }
  }
  else {
    pcVar3 = (char *)0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.field_2._8_8_);
  }
  return pcVar3;
}

Assistant:

char const*
qpdf_get_info_key(qpdf_data qpdf, char const* key)
{
    char const* result = nullptr;
    QPDFObjectHandle trailer = qpdf->qpdf->getTrailer();
    if (trailer.hasKey("/Info")) {
        QPDFObjectHandle info = trailer.getKey("/Info");
        if (info.hasKey(key)) {
            QPDFObjectHandle value = info.getKey(key);
            if (value.isString()) {
                qpdf->tmp_string = value.getStringValue();
                result = qpdf->tmp_string.c_str();
            }
        }
    }
    QTC::TC("qpdf", "qpdf-c get_info_key", (result == nullptr ? 0 : 1));
    return result;
}